

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

void __thiscall cm::String::String<char_const*,void>(String *this,char **s)

{
  String local_38;
  char **local_18;
  char **s_local;
  String *this_local;
  
  local_18 = s;
  s_local = (char **)this;
  IntoString<char_*>::into_string(&local_38,*s);
  String(this,&local_38,0);
  ~String(&local_38);
  return;
}

Assistant:

String(T&& s)
    : String(IntoString<T>::into_string(std::forward<T>(s)), Private())
  {
  }